

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O0

void brotli::CompareAndPushToQueue<brotli::Histogram<704>>
               (Histogram<704> *out,uint32_t *cluster_size,uint32_t idx1,uint32_t idx2,
               vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *pairs)

{
  bool bVar1;
  double *pdVar2;
  reference pvVar3;
  double dVar4;
  double local_b78;
  double cost_combo;
  Histogram<704> combo;
  double threshold;
  HistogramPair p;
  bool store_pair;
  uint32_t t;
  vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *pairs_local;
  uint32_t idx2_local;
  uint32_t idx1_local;
  uint32_t *cluster_size_local;
  Histogram<704> *out_local;
  
  if (idx1 != idx2) {
    pairs_local._0_4_ = idx2;
    pairs_local._4_4_ = idx1;
    if (idx2 < idx1) {
      p.cost_diff._4_4_ = idx2;
      pairs_local._0_4_ = idx1;
      pairs_local._4_4_ = idx2;
    }
    p.cost_diff._3_1_ = 0;
    threshold._0_4_ = pairs_local._4_4_;
    threshold._4_4_ = (uint32_t)pairs_local;
    dVar4 = ClusterCostDiff((ulong)cluster_size[pairs_local._4_4_],
                            (ulong)cluster_size[(uint32_t)pairs_local]);
    p.cost_combo = (dVar4 * 0.5 - out[pairs_local._4_4_].bit_cost_) -
                   out[(uint32_t)pairs_local].bit_cost_;
    if (out[pairs_local._4_4_].total_count_ == 0) {
      p.cost_diff._3_1_ = 1;
      p._0_8_ = out[(uint32_t)pairs_local].bit_cost_;
    }
    else if (out[(uint32_t)pairs_local].total_count_ == 0) {
      p.cost_diff._3_1_ = 1;
      p._0_8_ = out[pairs_local._4_4_].bit_cost_;
    }
    else {
      bVar1 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::empty
                        (pairs);
      if (bVar1) {
        local_b78 = 1e+99;
      }
      else {
        combo.bit_cost_ = 0.0;
        pvVar3 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::
                 operator[](pairs,0);
        pdVar2 = std::max<double>(&combo.bit_cost_,&pvVar3->cost_diff);
        local_b78 = *pdVar2;
      }
      memcpy(&cost_combo,out + pairs_local._4_4_,0xb10);
      Histogram<704>::AddHistogram((Histogram<704> *)&cost_combo,out + (uint32_t)pairs_local);
      dVar4 = PopulationCost<704>((Histogram<704> *)&cost_combo);
      if (dVar4 < local_b78 - p.cost_combo) {
        p.cost_diff._3_1_ = 1;
        p._0_8_ = dVar4;
      }
    }
    if ((p.cost_diff._3_1_ & 1) != 0) {
      p.cost_combo = (double)p._0_8_ + p.cost_combo;
      bVar1 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::empty
                        (pairs);
      if (!bVar1) {
        pvVar3 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::front
                           (pairs);
        bVar1 = operator<(pvVar3,(HistogramPair *)&threshold);
        if (bVar1) {
          pvVar3 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::front
                             (pairs);
          std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::push_back
                    (pairs,pvVar3);
          pvVar3 = std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::front
                             (pairs);
          pvVar3->idx1 = threshold._0_4_;
          pvVar3->idx2 = threshold._4_4_;
          pvVar3->cost_combo = (double)p._0_8_;
          pvVar3->cost_diff = p.cost_combo;
          return;
        }
      }
      std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::push_back
                (pairs,(value_type *)&threshold);
    }
  }
  return;
}

Assistant:

void CompareAndPushToQueue(const HistogramType* out,
                           const uint32_t* cluster_size,
                           uint32_t idx1, uint32_t idx2,
                           std::vector<HistogramPair>* pairs) {
  if (idx1 == idx2) {
    return;
  }
  if (idx2 < idx1) {
    uint32_t t = idx2;
    idx2 = idx1;
    idx1 = t;
  }
  bool store_pair = false;
  HistogramPair p;
  p.idx1 = idx1;
  p.idx2 = idx2;
  p.cost_diff = 0.5 * ClusterCostDiff(cluster_size[idx1], cluster_size[idx2]);
  p.cost_diff -= out[idx1].bit_cost_;
  p.cost_diff -= out[idx2].bit_cost_;

  if (out[idx1].total_count_ == 0) {
    p.cost_combo = out[idx2].bit_cost_;
    store_pair = true;
  } else if (out[idx2].total_count_ == 0) {
    p.cost_combo = out[idx1].bit_cost_;
    store_pair = true;
  } else {
    double threshold = pairs->empty() ? 1e99 :
        std::max(0.0, (*pairs)[0].cost_diff);
    HistogramType combo = out[idx1];
    combo.AddHistogram(out[idx2]);
    double cost_combo = PopulationCost(combo);
    if (cost_combo < threshold - p.cost_diff) {
      p.cost_combo = cost_combo;
      store_pair = true;
    }
  }
  if (store_pair) {
    p.cost_diff += p.cost_combo;
    if (!pairs->empty() && (pairs->front() < p)) {
      // Replace the top of the queue if needed.
      pairs->push_back(pairs->front());
      pairs->front() = p;
    } else {
      pairs->push_back(p);
    }
  }
}